

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

bool __thiscall
libtorrent::aux::anon_unknown_119::last_optimistic_unchoke_cmp::operator()
          (last_optimistic_unchoke_cmp *this,opt_unchoke_candidate *l,opt_unchoke_candidate *r)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t uVar5;
  uint64_t uVar6;
  bool bVar7;
  
  iVar3 = (*(((l->peer->
              super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_bandwidth_socket)._vptr_bandwidth_socket[7])();
  iVar4 = (*(((r->peer->
              super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_bandwidth_socket)._vptr_bandwidth_socket[7])();
  uVar1 = *(ushort *)(CONCAT44(extraout_var_00,iVar4) + 0x14);
  uVar2 = *(ushort *)(CONCAT44(extraout_var,iVar3) + 0x14);
  bVar7 = uVar2 < uVar1;
  if (uVar2 == uVar1) {
    uVar5 = get_ext_priority((last_optimistic_unchoke_cmp *)this->plugins,l);
    uVar6 = get_ext_priority((last_optimistic_unchoke_cmp *)this->plugins,r);
    bVar7 = uVar5 < uVar6;
  }
  return bVar7;
}

Assistant:

bool operator()(opt_unchoke_candidate const& l
				, opt_unchoke_candidate const& r) const
			{
				torrent_peer const* pil = (*l.peer)->peer_info_struct();
				torrent_peer const* pir = (*r.peer)->peer_info_struct();
				if (pil->last_optimistically_unchoked
					!= pir->last_optimistically_unchoked)
				{
					return pil->last_optimistically_unchoked
						< pir->last_optimistically_unchoked;
				}
				else
				{
					return get_ext_priority(l) < get_ext_priority(r);
				}
			}